

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest20_21::testProgram
          (FunctionalTest20_21 *this,program **programs,bool is_separable,GLuint (*test_cases) [5],
          GLuint n_test_cases)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  ulong uVar6;
  undefined7 in_register_00000011;
  GLuint i;
  long lVar7;
  long lVar5;
  
  if ((int)CONCAT71(in_register_00000011,is_separable) == 0) {
    Utils::program::use(*programs);
    for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
      (*this->m_shared_contexts[lVar7]->_vptr_RenderContext[8])();
      Utils::program::use(*programs);
    }
  }
  else {
    iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar5 = CONCAT44(extraout_var,iVar3);
    (**(code **)(lVar5 + 0x1680))(0);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"UseProgram",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x2913);
    prepareProgramPipeline(this,this->m_program_pipelines + 4,programs);
    for (lVar7 = 0x78; lVar7 != 0x88; lVar7 = lVar7 + 4) {
      (**(code **)(**(long **)((long)this + lVar7 * 2 + -0x60) + 0x40))();
      (**(code **)(lVar5 + 0x1680))(0);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"UseProgram",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x291d);
      prepareProgramPipeline
                (this,(GLuint *)((long)this->m_program_pipelines + lVar7 + -0x78),programs);
    }
  }
  uVar1 = 0;
  do {
    uVar6 = uVar1;
    if (n_test_cases == uVar6) break;
    bVar2 = testCase(this,*test_cases);
    test_cases = test_cases + 1;
    uVar1 = uVar6 + 1;
  } while (bVar2);
  return n_test_cases <= uVar6;
}

Assistant:

bool FunctionalTest20_21::testProgram(Utils::program** programs, bool is_separable, const glw::GLuint test_cases[][5],
									  glw::GLuint n_test_cases)
{
	/* Set program/pipeline as current for all contexts */
	if (false == is_separable)
	{
		programs[0]->use();

		for (GLuint i = 0; i < m_n_shared_contexts; ++i)
		{
			m_shared_contexts[i]->makeCurrent();
			programs[0]->use();
		}
	}
	else
	{
		/* GL entry points */
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		/* Make sure that program pipeline will be used */
		gl.useProgram(0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "UseProgram");

		prepareProgramPipeline(m_program_pipelines[m_n_shared_contexts], programs);

		for (GLuint i = 0; i < m_n_shared_contexts; ++i)
		{
			m_shared_contexts[i]->makeCurrent();

			/* Make sure that program pipeline will be used */
			gl.useProgram(0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "UseProgram");

			prepareProgramPipeline(m_program_pipelines[i], programs);
		}
	}

	/* Execute test */
	bool result = true;
	for (GLuint i = 0; i < n_test_cases; ++i)
	{
		if (false == testCase(test_cases[i]))
		{
			result = false;
			break;
		}
	}

	return result;
}